

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_primitive_field.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::cpp::PrimitiveOneofFieldGenerator::GenerateMergeFromCodedStream
          (PrimitiveOneofFieldGenerator *this,Printer *printer)

{
  io::Printer::Print(printer,&(this->super_PrimitiveFieldGenerator).variables_,
                     "clear_$oneof_name$();\nDO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<\n         $type$, $wire_format_field_type$>(\n       input, &$oneof_prefix$$name$_)));\nset_has_$name$();\n"
                    );
  return;
}

Assistant:

void PrimitiveOneofFieldGenerator::
GenerateMergeFromCodedStream(io::Printer* printer) const {
  printer->Print(variables_,
    "clear_$oneof_name$();\n"
    "DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<\n"
    "         $type$, $wire_format_field_type$>(\n"
    "       input, &$oneof_prefix$$name$_)));\n"
    "set_has_$name$();\n");
}